

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall tf::TFProfManager::TFProfManager(TFProfManager *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"TF_ENABLE_PROFILER",&local_31);
  get_env(&this->_fpath,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->_observers).
  super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_observers).
  super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->_observers).
  super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  return;
}

Assistant:

inline TFProfManager::TFProfManager() :
  _fpath {get_env(TF_ENABLE_PROFILER)} {

}